

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowViewportThumbnails(void)

{
  undefined8 *puVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  int iVar4;
  ImDrawList *pIVar5;
  ImFont *font;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ImGuiWindow *pIVar18;
  ImU32 IVar19;
  undefined4 extraout_EAX;
  uint uVar20;
  char *pcVar21;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  ImGuiContext *pIVar25;
  ImGuiWindow *this;
  ImGuiViewportP *pIVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined8 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  undefined8 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  ImVec4 local_178;
  ImVec2 local_168;
  ImVec2 IStack_160;
  undefined1 local_158 [16];
  ImGuiWindow *local_148;
  ImGuiWindow *local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  ImGuiContext *local_d0;
  ImDrawList *local_c8;
  long local_c0;
  ImGuiContext *local_b8;
  ImGuiViewportP *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar4 = (GImGui->Viewports).Size;
  if ((long)iVar4 < 1) {
    uVar30 = 0;
    uVar35 = 0;
  }
  else {
    local_148 = GImGui->CurrentWindow;
    auVar32 = ZEXT816(0);
    lVar22 = 0;
    auVar37 = ZEXT816(0);
    do {
      pIVar26 = (GImGui->Viewports).Data[lVar22];
      IVar2 = (pIVar26->super_ImGuiViewport).Pos;
      auVar36._8_8_ = 0;
      auVar36._0_4_ = IVar2.x;
      auVar36._4_4_ = IVar2.y;
      IVar3 = (pIVar26->super_ImGuiViewport).Size;
      auVar31._0_4_ = IVar3.x + IVar2.x;
      auVar31._4_4_ = IVar3.y + IVar2.y;
      auVar31._8_8_ = 0;
      auVar32 = maxps(auVar31,auVar32);
      auVar37 = minps(auVar36,auVar37);
      lVar22 = lVar22 + 1;
    } while (iVar4 != lVar22);
    uVar30 = auVar32._0_8_;
    uVar35 = auVar37._0_8_;
    if (0 < iVar4) {
      IVar2 = (local_148->DC).CursorPos;
      local_88 = auVar37._0_4_ * -0.125 + IVar2.x;
      fStack_84 = auVar37._4_4_ * -0.125 + IVar2.y;
      fStack_80 = auVar37._8_4_ * 0.0 + 0.0;
      fStack_7c = auVar37._12_4_ * 0.0 + 0.0;
      lVar22 = 0;
      local_d0 = GImGui;
      local_a8 = auVar37;
      local_98 = auVar32;
      do {
        pIVar25 = GImGui;
        pIVar26 = (local_d0->Viewports).Data[lVar22];
        local_c8 = local_148->DrawList;
        local_140 = GImGui->CurrentWindow;
        IVar2 = (pIVar26->super_ImGuiViewport).Pos;
        IVar3 = (pIVar26->super_ImGuiViewport).Size;
        fVar33 = IVar2.x;
        fVar29 = IVar2.y;
        local_168.x = fVar33 * 0.125 + local_88;
        local_168.y = fVar29 * 0.125 + fStack_84;
        fStack_f0 = fStack_80 + 0.0;
        local_f8._0_4_ = local_168.x;
        local_f8._4_4_ = local_168.y;
        fStack_ec = fStack_7c + 0.0;
        local_158._8_8_ = 0;
        local_158._0_4_ = IVar3.x;
        local_158._4_4_ = IVar3.y;
        IStack_160.x = (fVar33 + IVar3.x) * 0.125 + local_88;
        IStack_160.y = (fVar29 + IVar3.y) * 0.125 + fStack_84;
        local_e8._4_4_ = IStack_160.y;
        local_e8._0_4_ = IStack_160.x;
        fStack_e0 = fStack_80 + 0.0;
        fStack_dc = fStack_7c + 0.0;
        local_118 = ZEXT416((uint)(pIVar26->super_ImGuiViewport).Size.y);
        _fStack_100 = 0;
        local_108._0_4_ = (pIVar26->super_ImGuiViewport).Pos.x;
        local_108._4_4_ = (pIVar26->super_ImGuiViewport).Pos.y;
        fVar33 = *(float *)(&DAT_0021ddb0 +
                           (ulong)(-1 < (char)(pIVar26->super_ImGuiViewport).Flags) * 4);
        pIVar5 = local_140->DrawList;
        local_178.x = (GImGui->Style).Colors[5].x;
        local_178.y = (GImGui->Style).Colors[5].y;
        uVar8 = (GImGui->Style).Colors[5].z;
        uVar9 = (GImGui->Style).Colors[5].w;
        local_178.w = fVar33 * 0.4 * (GImGui->Style).Alpha * (float)uVar9;
        local_178.z = (float)uVar8;
        local_c0 = lVar22;
        IVar19 = ColorConvertFloat4ToU32(&local_178);
        ImDrawList::AddRectFilled(pIVar5,&local_168,&IStack_160,IVar19,0.0,0xf);
        uVar20 = (pIVar25->Windows).Size;
        if (uVar20 != 0) {
          auVar32._0_4_ = (float)local_e8._0_4_ - (float)local_f8._0_4_;
          auVar32._4_4_ = (float)local_e8._4_4_ - (float)local_f8._4_4_;
          auVar32._8_4_ = fStack_e0 - fStack_f0;
          auVar32._12_4_ = fStack_dc - fStack_ec;
          auVar37._4_4_ = local_118._0_4_;
          auVar37._0_4_ = local_158._0_4_;
          auVar37._8_4_ = local_158._8_4_;
          auVar37._12_4_ = local_158._12_4_;
          _local_e8 = divps(auVar32,auVar37);
          local_78 = local_e8._4_4_;
          local_68 = (float)local_f8._4_4_ - (float)local_108._4_4_ * local_78;
          uVar23 = 0;
          local_b8 = pIVar25;
          local_f8._4_4_ = local_68;
          local_f8._0_4_ = (float)local_f8._0_4_ - (float)local_108._0_4_ * local_e8._0_4_;
          fStack_f0 = fStack_f0 - fStack_100 * local_e8._8_4_;
          fStack_ec = fStack_ec - fStack_fc * local_e8._12_4_;
          local_b0 = pIVar26;
          fStack_74 = local_78;
          fStack_70 = local_78;
          fStack_6c = local_78;
          fStack_64 = local_68;
          fStack_60 = local_68;
          fStack_5c = local_68;
          do {
            this = (pIVar25->Windows).Data[uVar23];
            if (((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) &&
               (this->Viewport == pIVar26)) {
              fVar29 = (this->Pos).x;
              _local_108 = ZEXT416((uint)fVar29);
              fVar28 = (this->Pos).y;
              local_58 = ZEXT416((uint)fVar28);
              local_48 = ZEXT416((uint)((this->Size).x + fVar29));
              local_118 = ZEXT416((uint)((this->Size).y + fVar28));
              local_158 = ZEXT416((uint)((this->SizeFull).x + fVar29));
              ImGuiWindow::TitleBarHeight(this);
              pIVar18 = local_140;
              fVar40 = (float)(int)((float)local_58._0_4_ * local_78 + local_68);
              fVar38 = (float)(int)((float)local_48._0_4_ * (float)local_e8._0_4_ +
                                   (float)local_f8._0_4_);
              fVar39 = (float)(int)((this->Pos).y * (float)local_e8._4_4_ + (float)local_f8._4_4_);
              fVar27 = local_168.x;
              fVar28 = local_168.y;
              fVar34 = fVar39 + 5.0;
              fVar29 = fVar28;
              if ((fVar28 <= fVar40) && (fVar29 = IStack_160.y, fVar40 <= IStack_160.y)) {
                fVar29 = fVar40;
              }
              fVar41 = (float)(int)((float)local_108._0_4_ * (float)local_e8._0_4_ +
                                   (float)local_f8._0_4_);
              fVar42 = (float)(int)((float)local_118._0_4_ * (float)local_e8._4_4_ +
                                   (float)local_f8._4_4_);
              auVar7._4_4_ = -(uint)(fVar41 < fVar27);
              auVar7._0_4_ = -(uint)(fVar41 < fVar27);
              auVar7._8_4_ = -(uint)(fVar42 < fVar28);
              auVar7._12_4_ = -(uint)(fVar42 < fVar28);
              uVar20 = movmskpd(extraout_EAX,auVar7);
              fVar40 = fVar27;
              if (((uVar20 & 1) == 0) && (fVar40 = IStack_160.x, fVar41 <= IStack_160.x)) {
                fVar40 = fVar41;
              }
              local_138.y = fVar29;
              local_138.x = fVar40;
              fVar29 = fVar28;
              if (((uVar20 & 2) == 0) && (fVar29 = IStack_160.y, fVar42 <= IStack_160.y)) {
                fVar29 = fVar42;
              }
              auVar6._4_4_ = -(uint)(fVar38 < fVar27);
              auVar6._0_4_ = -(uint)(fVar38 < fVar27);
              auVar6._8_4_ = -(uint)(fVar39 < fVar28);
              auVar6._12_4_ = -(uint)(fVar39 < fVar28);
              uVar20 = movmskpd(uVar20,auVar6);
              fVar40 = fVar27;
              if (((uVar20 & 1) == 0) && (fVar40 = IStack_160.x, fVar38 <= IStack_160.x)) {
                fVar40 = fVar38;
              }
              local_130.y = fVar29;
              local_130.x = fVar40;
              fVar29 = fVar28;
              if (((uVar20 & 2) == 0) && (fVar29 = IStack_160.y, fVar39 <= IStack_160.y)) {
                fVar29 = fVar39;
              }
              fVar39 = (float)(int)((this->Pos).x * (float)local_e8._0_4_ + (float)local_f8._0_4_);
              fVar38 = IStack_160.x;
              if (fVar39 <= IStack_160.x) {
                fVar38 = fVar39;
              }
              local_128.x = (float)(-(uint)(fVar39 < fVar27) & (uint)fVar27 |
                                   ~-(uint)(fVar39 < fVar27) & (uint)fVar38);
              local_128.y = fVar29;
              if ((fVar28 <= fVar34) && (fVar28 = IStack_160.y, fVar34 <= IStack_160.y)) {
                fVar28 = fVar34;
              }
              fVar34 = (float)(int)((float)local_158._0_4_ * (float)local_e8._0_4_ +
                                   (float)local_f8._0_4_);
              fVar29 = IStack_160.x;
              if (fVar34 <= IStack_160.x) {
                fVar29 = fVar34;
              }
              local_120.y = fVar28;
              local_120.x = (float)(-(uint)(fVar34 < fVar27) & (uint)fVar27 |
                                   ~-(uint)(fVar34 < fVar27) & (uint)fVar29);
              if (pIVar25->NavWindow == (ImGuiWindow *)0x0) {
                uVar20 = 10;
              }
              else {
                uVar20 = this->RootWindowForTitleBarHighlight ==
                         pIVar25->NavWindow->RootWindowForTitleBarHighlight | 10;
              }
              pIVar5 = local_140->DrawList;
              local_178.x = (GImGui->Style).Colors[2].x;
              local_178.y = (GImGui->Style).Colors[2].y;
              uVar10 = (GImGui->Style).Colors[2].z;
              uVar11 = (GImGui->Style).Colors[2].w;
              local_178.w = (GImGui->Style).Alpha * fVar33 * (float)uVar11;
              local_178.z = (float)uVar10;
              IVar19 = ColorConvertFloat4ToU32(&local_178);
              ImDrawList::AddRectFilled(pIVar5,&local_138,&local_130,IVar19,0.0,0xf);
              pIVar5 = pIVar18->DrawList;
              puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar20 << 4));
              local_178._0_8_ = *puVar1;
              uVar30 = puVar1[1];
              local_178.w = (float)((ulong)uVar30 >> 0x20);
              local_178.z = (float)uVar30;
              local_178.w = (GImGui->Style).Alpha * fVar33 * local_178.w;
              IVar19 = ColorConvertFloat4ToU32(&local_178);
              ImDrawList::AddRectFilled(pIVar5,&local_128,&local_120,IVar19,0.0,0xf);
              pIVar5 = pIVar18->DrawList;
              local_178.x = (GImGui->Style).Colors[5].x;
              local_178.y = (GImGui->Style).Colors[5].y;
              uVar12 = (GImGui->Style).Colors[5].z;
              uVar13 = (GImGui->Style).Colors[5].w;
              local_178.w = (GImGui->Style).Alpha * fVar33 * (float)uVar13;
              local_178.z = (float)uVar12;
              IVar19 = ColorConvertFloat4ToU32(&local_178);
              ImDrawList::AddRect(pIVar5,&local_138,&local_130,IVar19,0.0,0xf,1.0);
              pIVar25 = local_b8;
              if ((this->DockNodeAsHost == (ImGuiDockNode *)0x0) ||
                 (this = this->DockNodeAsHost->VisibleWindow, this != (ImGuiWindow *)0x0)) {
                pIVar5 = local_140->DrawList;
                font = local_b8->Font;
                local_158._0_4_ = local_b8->FontSize;
                local_178.x = (GImGui->Style).Colors[0].x;
                local_178.y = (GImGui->Style).Colors[0].y;
                uVar14 = (GImGui->Style).Colors[0].z;
                uVar15 = (GImGui->Style).Colors[0].w;
                local_178.w = (GImGui->Style).Alpha * fVar33 * (float)uVar15;
                local_178.z = (float)uVar14;
                IVar19 = ColorConvertFloat4ToU32(&local_178);
                for (pcVar21 = this->Name; pcVar24 = (char *)0xffffffffffffffff,
                    pcVar21 != (char *)0xffffffffffffffff; pcVar21 = pcVar21 + 1) {
                  pcVar24 = pcVar21;
                  if (*pcVar21 == '#') {
                    if (pcVar21[1] == '#') break;
                  }
                  else if (*pcVar21 == '\0') break;
                }
                ImDrawList::AddText(pIVar5,font,(float)local_158._0_4_,&local_128,IVar19,this->Name,
                                    pcVar24,0.0,(ImVec4 *)0x0);
              }
              uVar20 = (pIVar25->Windows).Size;
              pIVar26 = local_b0;
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar20);
        }
        local_178.x = (GImGui->Style).Colors[5].x;
        local_178.y = (GImGui->Style).Colors[5].y;
        uVar16 = (GImGui->Style).Colors[5].z;
        uVar17 = (GImGui->Style).Colors[5].w;
        local_178.w = fVar33 * (GImGui->Style).Alpha * (float)uVar17;
        local_178.z = (float)uVar16;
        IVar19 = ColorConvertFloat4ToU32(&local_178);
        ImDrawList::AddRect(local_c8,&local_168,&IStack_160,IVar19,0.0,0xf,1.0);
        lVar22 = local_c0 + 1;
      } while (lVar22 < (local_d0->Viewports).Size);
      uVar30 = local_98._0_8_;
      uVar35 = local_a8._0_8_;
    }
  }
  local_178.x = ((float)uVar30 - (float)uVar35) * 0.125;
  local_178.y = ((float)((ulong)uVar30 >> 0x20) - (float)((ulong)uVar35 >> 0x20)) * 0.125;
  Dummy((ImVec2 *)&local_178);
  return;
}

Assistant:

void ImGui::ShowViewportThumbnails()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We don't display full monitor bounds (we could, but it often looks awkward), instead we display just enough to cover all of our viewports.
    float SCALE = 1.0f / 8.0f;
    ImRect bb_full;
    //for (int n = 0; n < g.PlatformIO.Monitors.Size; n++)
    //    bb_full.Add(GetPlatformMonitorMainRect(g.PlatformIO.Monitors[n]));
    for (int n = 0; n < g.Viewports.Size; n++)
        bb_full.Add(g.Viewports[n]->GetRect());
    ImVec2 p = window->DC.CursorPos;
    ImVec2 off = p - bb_full.Min * SCALE;
    //for (int n = 0; n < g.PlatformIO.Monitors.Size; n++)
    //    window->DrawList->AddRect(off + g.PlatformIO.Monitors[n].MainPos * SCALE, off + (g.PlatformIO.Monitors[n].MainPos + g.PlatformIO.Monitors[n].MainSize) * SCALE, ImGui::GetColorU32(ImGuiCol_Border));
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        ImRect viewport_draw_bb(off + (viewport->Pos) * SCALE, off + (viewport->Pos + viewport->Size) * SCALE);
        RenderViewportThumbnail(window->DrawList, viewport, viewport_draw_bb);
    }
    ImGui::Dummy(bb_full.GetSize() * SCALE);
}